

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall
CLIntercept::checkRemoveCommandBufferInfo(CLIntercept *this,cl_command_buffer_khr cmdbuf)

{
  bool bVar1;
  pointer ppVar2;
  CLdispatchX *pCVar3;
  iterator __position;
  pointer ppVar4;
  cl_command_buffer_khr in_RSI;
  _cl_mutable_command_khr *cmd;
  iterator __end5;
  iterator __begin5;
  CMutableCommandList *__range5;
  CMutableCommandList *cmdList;
  iterator cmditer;
  cl_int errorCode;
  cl_uint refCount;
  CLdispatchX *dispatchX;
  cl_platform_id platform;
  iterator iter;
  lock_guard<std::mutex> lock;
  string *in_stack_000004b8;
  cl_platform_id in_stack_000004c0;
  CLIntercept *in_stack_000004c8;
  map<_cl_command_buffer_khr_*,_std::__cxx11::list<_cl_mutable_command_khr_*,_std::allocator<_cl_mutable_command_khr_*>_>,_std::less<_cl_command_buffer_khr_*>,_std::allocator<std::pair<_cl_command_buffer_khr_*const,_std::__cxx11::list<_cl_mutable_command_khr_*,_std::allocator<_cl_mutable_command_khr_*>_>_>_>_>
  *in_stack_fffffffffffffed8;
  map<_cl_command_buffer_khr_*,_SCommandBufferRecord,_std::less<_cl_command_buffer_khr_*>,_std::allocator<std::pair<_cl_command_buffer_khr_*const,_SCommandBufferRecord>_>_>
  *in_stack_fffffffffffffee0;
  iterator in_stack_fffffffffffffee8;
  cl_platform_id in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  _Self local_b8;
  _Self local_b0;
  list<_cl_mutable_command_khr_*,_std::allocator<_cl_mutable_command_khr_*>_> *local_a8;
  list<_cl_mutable_command_khr_*,_std::allocator<_cl_mutable_command_khr_*>_> *local_a0;
  _Self local_98;
  _Self local_90;
  _Base_ptr local_88;
  _Base_ptr local_80;
  cl_int local_78;
  int local_74;
  CLdispatchX *local_70;
  allocator local_61;
  string local_60 [32];
  _cl_platform_id *local_40;
  _Self local_38 [3];
  _Self local_20 [2];
  cl_command_buffer_khr local_10;
  
  local_10 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffee0,
             (mutex_type *)in_stack_fffffffffffffed8);
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<_cl_command_buffer_khr_*,__cl_platform_id_*,_std::less<_cl_command_buffer_khr_*>,_std::allocator<std::pair<_cl_command_buffer_khr_*const,__cl_platform_id_*>_>_>
       ::find((map<_cl_command_buffer_khr_*,__cl_platform_id_*,_std::less<_cl_command_buffer_khr_*>,_std::allocator<std::pair<_cl_command_buffer_khr_*const,__cl_platform_id_*>_>_>
               *)in_stack_fffffffffffffed8,(key_type *)0x20a2de);
  local_38[0]._M_node =
       (_Base_ptr)
       std::
       map<_cl_command_buffer_khr_*,__cl_platform_id_*,_std::less<_cl_command_buffer_khr_*>,_std::allocator<std::pair<_cl_command_buffer_khr_*const,__cl_platform_id_*>_>_>
       ::end((map<_cl_command_buffer_khr_*,__cl_platform_id_*,_std::less<_cl_command_buffer_khr_*>,_std::allocator<std::pair<_cl_command_buffer_khr_*const,__cl_platform_id_*>_>_>
              *)in_stack_fffffffffffffed8);
  bVar1 = std::operator!=(local_20,local_38);
  if (bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<_cl_command_buffer_khr_*const,__cl_platform_id_*>_>::
             operator->((_Rb_tree_iterator<std::pair<_cl_command_buffer_khr_*const,__cl_platform_id_*>_>
                         *)0x20a336);
    local_40 = ppVar2->second;
    pCVar3 = CLIntercept::dispatchX
                       ((CLIntercept *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)
                        ,in_stack_fffffffffffffef0);
    if (pCVar3->clGetCommandBufferInfoKHR ==
        (_func_cl_int_cl_command_buffer_khr_cl_command_buffer_info_khr_size_t_void_ptr_size_t_ptr *)
        0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_60,"clGetCommandBufferInfoKHR",&local_61);
      getExtensionFunctionAddress(in_stack_000004c8,in_stack_000004c0,in_stack_000004b8);
      std::__cxx11::string::~string(local_60);
      std::allocator<char>::~allocator((allocator<char> *)&local_61);
    }
    local_70 = CLIntercept::dispatchX
                         ((CLIntercept *)
                          CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                          in_stack_fffffffffffffef0);
    if (local_70->clGetCommandBufferInfoKHR !=
        (_func_cl_int_cl_command_buffer_khr_cl_command_buffer_info_khr_size_t_void_ptr_size_t_ptr *)
        0x0) {
      local_74 = 0;
      local_78 = 0;
      local_78 = (*local_70->clGetCommandBufferInfoKHR)(local_10,0x1296,4,&local_74,(size_t *)0x0);
      if ((local_78 == 0) && (local_74 == 1)) {
        local_80 = local_20[0]._M_node;
        local_88 = (_Base_ptr)
                   std::
                   map<_cl_command_buffer_khr*,_cl_platform_id*,std::less<_cl_command_buffer_khr*>,std::allocator<std::pair<_cl_command_buffer_khr*const,_cl_platform_id*>>>
                   ::erase_abi_cxx11_((map<_cl_command_buffer_khr_*,__cl_platform_id_*,_std::less<_cl_command_buffer_khr_*>,_std::allocator<std::pair<_cl_command_buffer_khr_*const,__cl_platform_id_*>_>_>
                                       *)in_stack_fffffffffffffee0,in_stack_fffffffffffffee8);
        std::
        map<_cl_command_buffer_khr_*,_SCommandBufferRecord,_std::less<_cl_command_buffer_khr_*>,_std::allocator<std::pair<_cl_command_buffer_khr_*const,_SCommandBufferRecord>_>_>
        ::erase(in_stack_fffffffffffffee0,(key_type *)in_stack_fffffffffffffed8);
        __position = std::
                     map<_cl_command_buffer_khr_*,_std::__cxx11::list<_cl_mutable_command_khr_*,_std::allocator<_cl_mutable_command_khr_*>_>,_std::less<_cl_command_buffer_khr_*>,_std::allocator<std::pair<_cl_command_buffer_khr_*const,_std::__cxx11::list<_cl_mutable_command_khr_*,_std::allocator<_cl_mutable_command_khr_*>_>_>_>_>
                     ::find(in_stack_fffffffffffffed8,(key_type *)0x20a55f);
        local_90._M_node = __position._M_node;
        local_98._M_node =
             (_Base_ptr)
             std::
             map<_cl_command_buffer_khr_*,_std::__cxx11::list<_cl_mutable_command_khr_*,_std::allocator<_cl_mutable_command_khr_*>_>,_std::less<_cl_command_buffer_khr_*>,_std::allocator<std::pair<_cl_command_buffer_khr_*const,_std::__cxx11::list<_cl_mutable_command_khr_*,_std::allocator<_cl_mutable_command_khr_*>_>_>_>_>
             ::end(in_stack_fffffffffffffed8);
        bVar1 = std::operator!=(&local_90,&local_98);
        if (bVar1) {
          ppVar4 = std::
                   _Rb_tree_iterator<std::pair<_cl_command_buffer_khr_*const,_std::__cxx11::list<_cl_mutable_command_khr_*,_std::allocator<_cl_mutable_command_khr_*>_>_>_>
                   ::operator->((_Rb_tree_iterator<std::pair<_cl_command_buffer_khr_*const,_std::__cxx11::list<_cl_mutable_command_khr_*,_std::allocator<_cl_mutable_command_khr_*>_>_>_>
                                 *)0x20a5b7);
          local_a8 = &ppVar4->second;
          local_a0 = local_a8;
          local_b0._M_node =
               (_List_node_base *)
               std::__cxx11::
               list<_cl_mutable_command_khr_*,_std::allocator<_cl_mutable_command_khr_*>_>::begin
                         ((list<_cl_mutable_command_khr_*,_std::allocator<_cl_mutable_command_khr_*>_>
                           *)in_stack_fffffffffffffed8);
          local_b8._M_node =
               (_List_node_base *)
               std::__cxx11::
               list<_cl_mutable_command_khr_*,_std::allocator<_cl_mutable_command_khr_*>_>::end
                         ((list<_cl_mutable_command_khr_*,_std::allocator<_cl_mutable_command_khr_*>_>
                           *)in_stack_fffffffffffffed8);
          while (bVar1 = std::operator!=(&local_b0,&local_b8), bVar1) {
            std::_List_iterator<_cl_mutable_command_khr_*>::operator*
                      ((_List_iterator<_cl_mutable_command_khr_*> *)0x20a616);
            std::
            map<_cl_mutable_command_khr_*,_CLIntercept::SMutableCommandInfo,_std::less<_cl_mutable_command_khr_*>,_std::allocator<std::pair<_cl_mutable_command_khr_*const,_CLIntercept::SMutableCommandInfo>_>_>
            ::erase((map<_cl_mutable_command_khr_*,_CLIntercept::SMutableCommandInfo,_std::less<_cl_mutable_command_khr_*>,_std::allocator<std::pair<_cl_mutable_command_khr_*const,_CLIntercept::SMutableCommandInfo>_>_>
                     *)in_stack_fffffffffffffee0,(key_type *)in_stack_fffffffffffffed8);
            std::_List_iterator<_cl_mutable_command_khr_*>::operator++(&local_b0);
          }
          std::
          map<_cl_command_buffer_khr*,std::__cxx11::list<_cl_mutable_command_khr*,std::allocator<_cl_mutable_command_khr*>>,std::less<_cl_command_buffer_khr*>,std::allocator<std::pair<_cl_command_buffer_khr*const,std::__cxx11::list<_cl_mutable_command_khr*,std::allocator<_cl_mutable_command_khr*>>>>>
          ::erase_abi_cxx11_((map<_cl_command_buffer_khr_*,_std::__cxx11::list<_cl_mutable_command_khr_*,_std::allocator<_cl_mutable_command_khr_*>_>,_std::less<_cl_command_buffer_khr_*>,_std::allocator<std::pair<_cl_command_buffer_khr_*const,_std::__cxx11::list<_cl_mutable_command_khr_*,_std::allocator<_cl_mutable_command_khr_*>_>_>_>_>
                              *)in_stack_fffffffffffffee0,__position);
        }
      }
    }
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x20a68b);
  return;
}

Assistant:

void CLIntercept::checkRemoveCommandBufferInfo(
    cl_command_buffer_khr cmdbuf)
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    CCommandBufferInfoMap::iterator iter = m_CommandBufferInfoMap.find( cmdbuf );
    if( iter != m_CommandBufferInfoMap.end() )
    {
        cl_platform_id  platform = iter->second;
        if( dispatchX(platform).clGetCommandBufferInfoKHR == NULL )
        {
            getExtensionFunctionAddress(
                platform,
                "clGetCommandBufferInfoKHR" );
        }

        const auto& dispatchX = this->dispatchX(platform);
        if( dispatchX.clGetCommandBufferInfoKHR )
        {
            cl_uint refCount = 0;
            cl_int  errorCode = CL_SUCCESS;
            errorCode = dispatchX.clGetCommandBufferInfoKHR(
                cmdbuf,
                CL_COMMAND_BUFFER_REFERENCE_COUNT_KHR,
                sizeof( refCount ),
                &refCount,
                NULL );
            if( errorCode == CL_SUCCESS && refCount == 1 )
            {
                m_CommandBufferInfoMap.erase( iter );
                m_CommandBufferRecordMap.erase( cmdbuf );

                CCommandBufferMutableCommandsMap::iterator cmditer =
                    m_CommandBufferMutableCommandsMap.find( cmdbuf );
                if( cmditer != m_CommandBufferMutableCommandsMap.end() )
                {
                    CMutableCommandList&    cmdList = cmditer->second;
                    for( auto cmd : cmdList )
                    {
                        m_MutableCommandInfoMap.erase(cmd);
                    }

                    m_CommandBufferMutableCommandsMap.erase(cmditer);
                }
            }
        }
    }
}